

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

FT_Error ps_dimension_end(PS_Dimension dim,FT_UInt end_point,FT_Memory memory)

{
  PS_Mask __dest;
  PS_Mask mask;
  FT_UInt FVar1;
  PS_Mask pPVar2;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  FT_UInt FVar5;
  FT_UInt FVar6;
  undefined4 uVar7;
  FT_Error FVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  
  uVar9 = (ulong)(dim->masks).num_masks;
  if (uVar9 != 0) {
    (dim->masks).masks[uVar9 - 1].end_point = end_point;
  }
  uVar15 = (dim->counters).num_masks;
  uVar10 = uVar15;
  do {
    if ((int)uVar10 < 2) {
      return 0;
    }
    uVar13 = uVar10 - 1;
    for (uVar12 = uVar10 - 2; uVar10 = uVar13, -1 < (int)uVar12; uVar12 = uVar12 - 1) {
      pPVar2 = (dim->counters).masks;
      uVar11 = pPVar2[uVar12].num_bits;
      if (pPVar2[uVar13].num_bits < pPVar2[uVar12].num_bits) {
        uVar11 = pPVar2[uVar13].num_bits;
      }
      lVar14 = 0;
      for (; 7 < uVar11; uVar11 = uVar11 - 8) {
        if ((pPVar2[uVar13].bytes[lVar14] & pPVar2[uVar12].bytes[lVar14]) != 0) goto LAB_0020f857;
        lVar14 = lVar14 + 1;
      }
      if ((uVar11 != 0) &&
         (0xffU >> ((byte)uVar11 & 0x1f) <
          (uint)(pPVar2[uVar12].bytes[lVar14] & pPVar2[uVar13].bytes[lVar14]))) {
LAB_0020f857:
        uVar11 = uVar13;
        if (uVar13 < uVar12) {
          uVar11 = uVar12;
        }
        if (uVar13 <= uVar12) {
          uVar12 = uVar13;
        }
        if ((uVar12 < uVar11) && (uVar11 < uVar15)) {
          __dest = pPVar2 + uVar11;
          FVar1 = pPVar2[uVar11].num_bits;
          if (FVar1 != 0) {
            mask = pPVar2 + uVar12;
            uVar15 = pPVar2[uVar12].num_bits;
            if (uVar15 < FVar1) {
              FVar8 = ps_mask_ensure(mask,FVar1,memory);
              if (FVar8 != 0) {
                return FVar8;
              }
              for (; uVar15 < FVar1; uVar15 = uVar15 + 1) {
                if (uVar15 < mask->num_bits) {
                  mask->bytes[uVar15 >> 3] =
                       mask->bytes[uVar15 >> 3] & (byte)(-0x81 >> ((byte)uVar15 & 7));
                }
              }
            }
            pFVar3 = __dest->bytes;
            pFVar4 = mask->bytes;
            for (lVar14 = 0; FVar1 + 7 >> 3 != (uint)lVar14; lVar14 = lVar14 + 1) {
              pFVar4[lVar14] = pFVar4[lVar14] | pFVar3[lVar14];
            }
            uVar15 = (dim->counters).num_masks;
          }
          __dest->num_bits = 0;
          __dest->end_point = 0;
          if (0 < (int)(~uVar11 + uVar15)) {
            FVar6 = __dest->end_point;
            uVar7 = *(undefined4 *)&__dest->field_0x14;
            FVar1 = __dest->num_bits;
            FVar5 = __dest->max_bits;
            pFVar3 = __dest->bytes;
            uVar9 = (ulong)(~uVar11 + uVar15);
            memmove(__dest,__dest + 1,uVar9 * 0x18);
            pPVar2 = __dest + uVar9;
            pPVar2->num_bits = FVar1;
            pPVar2->max_bits = FVar5;
            pPVar2->bytes = pFVar3;
            __dest[uVar9].end_point = FVar6;
            *(undefined4 *)&__dest[uVar9].field_0x14 = uVar7;
            uVar15 = (dim->counters).num_masks;
          }
          uVar15 = uVar15 - 1;
          (dim->counters).num_masks = uVar15;
        }
        break;
      }
    }
  } while( true );
}

Assistant:

static FT_Error
  ps_dimension_end( PS_Dimension  dim,
                    FT_UInt       end_point,
                    FT_Memory     memory )
  {
    /* end hint mask table */
    ps_dimension_end_mask( dim, end_point );

    /* merge all counter masks into independent "paths" */
    return ps_mask_table_merge_all( &dim->counters, memory );
  }